

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSkylineNSymStructMatrix.cpp
# Opt level: O0

void __thiscall
TPZSkylineNSymStructMatrix<double,_TPZStructMatrixOR<double>_>::TPZSkylineNSymStructMatrix
          (TPZSkylineNSymStructMatrix<double,_TPZStructMatrixOR<double>_> *this,
          TPZAutoPointer<TPZCompMesh> *cmesh)

{
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_> *in_RSI;
  TPZSavable *in_RDI;
  TPZAutoPointer<TPZCompMesh> *in_stack_ffffffffffffffb8;
  TPZAutoPointer<TPZCompMesh> *in_stack_ffffffffffffffe0;
  void **in_stack_ffffffffffffffe8;
  
  TPZSavable::TPZSavable(in_RDI,&PTR_PTR_0252a2b8);
  TPZStrMatParInterface::TPZStrMatParInterface
            ((TPZStrMatParInterface *)(in_RDI + 0x1d),&PTR_construction_vtable_136__0252a2a8);
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer
            ((TPZAutoPointer<TPZCompMesh> *)in_RDI,in_stack_ffffffffffffffb8);
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>::TPZStructMatrix
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer((TPZAutoPointer<TPZCompMesh> *)in_RDI);
  in_RDI->_vptr_TPZSavable =
       (_func_int **)(TPZSkylineNSymStructMatrix<double,TPZStructMatrixOR<double>>::vtable + 0x68);
  in_RDI[0x1d]._vptr_TPZSavable =
       (_func_int **)(TPZSkylineNSymStructMatrix<double,TPZStructMatrixOR<double>>::vtable + 0x230);
  in_RDI->_vptr_TPZSavable =
       (_func_int **)(TPZSkylineNSymStructMatrix<double,TPZStructMatrixOR<double>>::vtable + 0x68);
  in_RDI[0x14]._vptr_TPZSavable =
       (_func_int **)(TPZSkylineNSymStructMatrix<double,TPZStructMatrixOR<double>>::vtable + 0x130);
  return;
}

Assistant:

TPZSkylineNSymStructMatrix<TVar,TPar>::TPZSkylineNSymStructMatrix(TPZAutoPointer<TPZCompMesh> cmesh)
  : TPZSkylineStructMatrix<TVar,TPar>(cmesh)
{
  ///nothing here
}